

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O2

bool __thiscall QPainterPath::intersects(QPainterPath *this,QRectF *rect)

{
  QPainterPathPrivate *pQVar1;
  Element *pEVar2;
  ulong uVar3;
  char cVar4;
  bool bVar5;
  bool bVar6;
  long lVar7;
  int i;
  ulong uVar8;
  long in_FS_OFFSET;
  double dVar9;
  double dVar10;
  qreal qVar11;
  QPointF local_88;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  undefined4 local_68;
  undefined4 uStack_64;
  undefined4 uStack_60;
  undefined4 uStack_5c;
  QRectF local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1 != (QPainterPathPrivate *)0x0) && ((int)(pQVar1->elements).d.size == 1)) {
    pEVar2 = (pQVar1->elements).d.ptr;
    local_58.xp = pEVar2->x;
    local_58.yp = pEVar2->y;
    cVar4 = QRectF::contains((QPointF *)rect);
    bVar5 = true;
    if (cVar4 != '\0') goto LAB_0039616c;
  }
  bVar5 = isEmpty(this);
  if (!bVar5) {
    local_58.w._0_4_ = 0xffffffff;
    local_58.w._4_4_ = 0xffffffff;
    local_58.h._0_4_ = 0xffffffff;
    local_58.h._4_4_ = 0xffffffff;
    local_58.xp = -NAN;
    local_58.yp = -NAN;
    controlPointRect(&local_58,this);
    local_68 = 0xffffffff;
    uStack_64 = 0xffffffff;
    uStack_60 = 0xffffffff;
    uStack_5c = 0xffffffff;
    local_78 = 0xffffffff;
    uStack_74 = 0xffffffff;
    uStack_70 = 0xffffffff;
    uStack_6c = 0xffffffff;
    QRectF::normalized();
    dVar9 = (double)CONCAT44(uStack_74,local_78);
    qVar11 = local_58.xp;
    if (local_58.xp <= dVar9) {
      qVar11 = dVar9;
    }
    dVar9 = dVar9 + (double)CONCAT44(uStack_64,local_68);
    dVar10 = local_58.xp + (double)CONCAT44(local_58.w._4_4_,local_58.w._0_4_);
    if (dVar10 <= dVar9) {
      dVar9 = dVar10;
    }
    if (qVar11 <= dVar9) {
      dVar9 = (double)CONCAT44(uStack_6c,uStack_70);
      qVar11 = local_58.yp;
      if (local_58.yp <= dVar9) {
        qVar11 = dVar9;
      }
      dVar9 = dVar9 + (double)CONCAT44(uStack_5c,uStack_60);
      dVar10 = local_58.yp + (double)CONCAT44(local_58.h._4_4_,local_58.h._0_4_);
      if (dVar10 <= dVar9) {
        dVar9 = dVar10;
      }
      if (qVar11 <= dVar9) {
        bVar6 = qt_painterpath_check_crossing(this,rect);
        bVar5 = true;
        if (!bVar6) {
          local_88 = QRectF::center(rect);
          bVar6 = contains(this,&local_88);
          if (!bVar6) {
            pQVar1 = (this->d_ptr).d.ptr;
            lVar7 = 0x10;
            for (uVar8 = 0; uVar3 = (pQVar1->elements).d.size, bVar5 = uVar8 < uVar3, uVar8 < uVar3;
                uVar8 = uVar8 + 1) {
              pEVar2 = (pQVar1->elements).d.ptr;
              if (*(int *)((long)&pEVar2->x + lVar7) == 0) {
                local_88 = *(QPointF *)((long)pEVar2 + lVar7 + -0x10);
                cVar4 = QRectF::contains((QPointF *)rect);
                if (cVar4 != '\0') break;
              }
              lVar7 = lVar7 + 0x18;
            }
          }
        }
        goto LAB_0039616c;
      }
    }
  }
  bVar5 = false;
LAB_0039616c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QPainterPath::intersects(const QRectF &rect) const
{
    if (elementCount() == 1 && rect.contains(elementAt(0)))
        return true;

    if (isEmpty())
        return false;

    QRectF cp = controlPointRect();
    QRectF rn = rect.normalized();

    // QRectF::intersects returns false if one of the rects is a null rect
    // which would happen for a painter path consisting of a vertical or
    // horizontal line
    if (qMax(rn.left(), cp.left()) > qMin(rn.right(), cp.right())
        || qMax(rn.top(), cp.top()) > qMin(rn.bottom(), cp.bottom()))
        return false;

    // If any path element cross the rect its bound to be an intersection
    if (qt_painterpath_check_crossing(this, rect))
        return true;

    if (contains(rect.center()))
        return true;

    Q_D(QPainterPath);

    // Check if the rectangle surrounds any subpath...
    for (int i=0; i<d->elements.size(); ++i) {
        const Element &e = d->elements.at(i);
        if (e.type == QPainterPath::MoveToElement && rect.contains(e))
            return true;
    }

    return false;
}